

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::join<std::__cxx11::string>
          (string *__return_storage_ptr__,Functional *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,string *sep)

{
  string *psVar1;
  undefined8 *puVar2;
  ostringstream out;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  puVar2 = *(undefined8 **)this;
  if (puVar2 != *(undefined8 **)(this + 8)) {
    do {
      if (puVar2 != *(undefined8 **)this) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   (char *)(list->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                   (long)(list->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,(char *)*puVar2,puVar2[1]);
      puVar2 = puVar2 + 4;
    } while (puVar2 != *(undefined8 **)(this + 8));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  psVar1 = (string *)std::ios_base::~ios_base(local_130);
  return psVar1;
}

Assistant:

static std::string join (const std::vector<T>& list, const std::string& sep)
{
	std::ostringstream	out;

	for (typename std::vector<T>::const_iterator iter = list.begin(); iter != list.end(); iter++)
	{
		if (iter != list.begin())
			out << sep;
		out << *iter;
	}

	return out.str();
}